

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_blindfactor.cpp
# Opt level: O0

void __thiscall
BlindFactor_Constractor_bytedata_Test::TestBody(BlindFactor_Constractor_bytedata_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_1f0;
  Message local_1e8 [2];
  CfdException *anon_var_0;
  BlindFactor local_1d0;
  byte local_1a9;
  char *pcStack_1a8;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  string local_198;
  undefined1 local_178 [8];
  ByteData bytedata_err;
  AssertHelper local_140;
  Message local_138;
  bool local_129;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_;
  Message local_110;
  ByteData256 local_108;
  string local_f0;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_1;
  Message local_b8;
  string local_b0;
  undefined1 local_90 [8];
  AssertionResult gtest_ar;
  BlindFactor blind_factor;
  allocator local_49;
  string local_48;
  undefined1 local_28 [8];
  ByteData bytedata;
  BlindFactor_Constractor_bytedata_Test *this_local;
  
  bytedata.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_48,"186c7f955149a5274b39e24b6a50d1d6479f552f6522d91f3a97d771f1c18179",
             &local_49);
  cfd::core::ByteData::ByteData((ByteData *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  cfd::core::BlindFactor::BlindFactor((BlindFactor *)&gtest_ar.message_,(ByteData *)local_28);
  cfd::core::BlindFactor::GetHex_abi_cxx11_(&local_b0,(BlindFactor *)&gtest_ar.message_);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_90,"blind_factor.GetHex().c_str()",
             "\"7981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18\"",pcVar2,
             "7981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18");
  std::__cxx11::string::~string((string *)&local_b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_blindfactor.cpp"
               ,0x42,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  cfd::core::BlindFactor::GetData(&local_108,(BlindFactor *)&gtest_ar.message_);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_f0,&local_108);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_d0,"blind_factor.GetData().GetHex().c_str()",
             "\"186c7f955149a5274b39e24b6a50d1d6479f552f6522d91f3a97d771f1c18179\"",pcVar2,
             "186c7f955149a5274b39e24b6a50d1d6479f552f6522d91f3a97d771f1c18179");
  std::__cxx11::string::~string((string *)&local_f0);
  cfd::core::ByteData256::~ByteData256(&local_108);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_blindfactor.cpp"
               ,0x45,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  bVar1 = cfd::core::BlindFactor::IsEmpty((BlindFactor *)&gtest_ar.message_);
  local_129 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_128,&local_129,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &bytedata_err.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_128,
               (AssertionResult *)"blind_factor.IsEmpty()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_blindfactor.cpp"
               ,0x46,pcVar2);
    testing::internal::AssertHelper::operator=(&local_140,&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    std::__cxx11::string::~string
              ((string *)
               &bytedata_err.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_198,"7f955149a5274b39e24b6a50d1d6479f552f6522d91f3a97d771f1c18179",
             (allocator *)((long)&gtest_msg.value + 7));
  cfd::core::ByteData::ByteData((ByteData *)local_178,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffe58,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffe58);
  if (bVar1) {
    local_1a9 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::BlindFactor::BlindFactor(&local_1d0,(ByteData *)local_178);
      cfd::core::BlindFactor::operator=((BlindFactor *)&gtest_ar.message_,&local_1d0);
      cfd::core::BlindFactor::~BlindFactor(&local_1d0);
    }
    if ((local_1a9 & 1) != 0) goto LAB_004c024f;
    pcStack_1a8 = 
    "Expected: (blind_factor = BlindFactor(bytedata_err)) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_1e8);
  testing::internal::AssertHelper::AssertHelper
            (&local_1f0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_blindfactor.cpp"
             ,0x49,pcStack_1a8);
  testing::internal::AssertHelper::operator=(&local_1f0,local_1e8);
  testing::internal::AssertHelper::~AssertHelper(&local_1f0);
  testing::Message::~Message(local_1e8);
LAB_004c024f:
  cfd::core::ByteData::~ByteData((ByteData *)local_178);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)&gtest_ar.message_);
  cfd::core::ByteData::~ByteData((ByteData *)local_28);
  return;
}

Assistant:

TEST(BlindFactor, Constractor_bytedata) {
  ByteData bytedata(
      "186c7f955149a5274b39e24b6a50d1d6479f552f6522d91f3a97d771f1c18179");
  BlindFactor blind_factor(bytedata);
  EXPECT_STREQ(
      blind_factor.GetHex().c_str(),
      "7981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18");
  EXPECT_STREQ(
      blind_factor.GetData().GetHex().c_str(),
      "186c7f955149a5274b39e24b6a50d1d6479f552f6522d91f3a97d771f1c18179");
  EXPECT_FALSE(blind_factor.IsEmpty());
  ByteData bytedata_err(
      "7f955149a5274b39e24b6a50d1d6479f552f6522d91f3a97d771f1c18179");
  EXPECT_THROW((blind_factor = BlindFactor(bytedata_err)), CfdException);
}